

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_recv_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *source,
                 MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_recv_();
  return;
}

Assistant:

void mpiabi_recv_(
  const void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * source,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_recv_(
    buf,
    count,
    datatype,
    source,
    tag,
    comm,
    status,
    ierror
  );
}